

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoTriangle>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZGeoTriangle> *this,int64_t id,TPZVec<long> *nodeindexes,
          int matind,TPZGeoMesh *mesh)

{
  long lVar1;
  
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZSavable_016b8cd0;
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,&PTR_PTR_016b8928,id,matind,mesh);
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZGeoElRefLess_016b8628;
  pzgeom::TPZGeoTriangle::TPZGeoTriangle(&this->fGeo,nodeindexes);
  lVar1 = 0;
  do {
    *(undefined ***)((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar1) =
         &PTR__TPZGeoElSideIndex_016b1180;
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar1) = 0xffffffff;
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar1) = 0xffffffffffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0xa8);
  for (lVar1 = 0; lVar1 != 0xa8; lVar1 = lVar1 + 0x18) {
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar1) = 0xffffffffffffffff;
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar1) = 0xffffffff;
  }
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(int64_t id,TPZVec<int64_t> &nodeindexes,int matind,TPZGeoMesh &mesh) :
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(id,matind,mesh) , fGeo(nodeindexes) {
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
    fGeo.Initialize(this);
}